

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O3

bool __thiscall OpenMD::OpenMDBitSet::none(OpenMDBitSet *this)

{
  _Bit_iterator _Var1;
  
  _Var1 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    ((this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                     (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  return _Var1.super__Bit_iterator_base._M_offset ==
         (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
         ._M_finish.super__Bit_iterator_base._M_offset &&
         _Var1.super__Bit_iterator_base._M_p ==
         (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
         ._M_finish.super__Bit_iterator_base._M_p;
}

Assistant:

bool OpenMDBitSet::none() {
    std::vector<bool>::iterator i =
        std::find(bitset_.begin(), bitset_.end(), true);
    return i == bitset_.end() ? true : false;
  }